

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O3

bool P_Teleport(AActor *thing,DVector3 *pos,DAngle *angle,int flags)

{
  Angle *pAVar1;
  uint uVar2;
  sector_t_conflict *psVar3;
  player_t *ppVar4;
  AInventory *this;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  bool bVar9;
  subsector_t *psVar10;
  Angle *pAVar11;
  player_t *ppVar12;
  byte bVar13;
  undefined4 uVar14;
  float fVar15;
  undefined4 uVar16;
  float fVar17;
  double dVar18;
  double dVar19;
  DVector2 fogpos;
  DVector2 vector;
  DVector3 local_88;
  double local_68;
  double dStack_60;
  TAngle<double> local_58;
  double local_50;
  DVector3 local_48;
  
  if (thing->player == (player_t *)0x0) {
    bVar13 = 0;
  }
  else {
    bVar13 = (*(byte *)((long)&thing->player->cheats + 1) & 0x20) >> 5;
  }
  local_88.Z = (thing->__Pos).Z;
  local_88.X = (thing->__Pos).X;
  local_88.Y = (thing->__Pos).Y;
  dVar6 = local_88.Z - thing->floorz;
  psVar10 = P_PointInSubsector(pos->X,pos->Y);
  psVar3 = psVar10->sector;
  ppVar4 = thing->player;
  ppVar12 = (player_t *)0x0;
  if ((ppVar4 != (player_t *)0x0) && (ppVar4->mo == (APlayerPawn *)thing)) {
    ppVar12 = ppVar4;
  }
  dVar19 = ((psVar3->floorplane).normal.Y * pos->Y +
           (psVar3->floorplane).normal.X * pos->X + (psVar3->floorplane).D) *
           (psVar3->floorplane).negiC;
  dVar18 = (pos->Y * (psVar3->ceilingplane).normal.Y +
           pos->X * (psVar3->ceilingplane).normal.X + (psVar3->ceilingplane).D) *
           (psVar3->ceilingplane).negiC;
  uVar14 = 0;
  uVar16 = 0;
  if (((thing->flags).Value & 0x10000) != 0) {
    dVar5 = (thing->Vel).X;
    dVar7 = (thing->Vel).Y;
    dVar5 = c_sqrt(dVar7 * dVar7 + dVar5 * dVar5);
    uVar14 = SUB84(dVar5,0);
    uVar16 = (undefined4)((ulong)dVar5 >> 0x20);
  }
  if ((flags & 0x10U) == 0) {
    if ((pos->Z == -2147483648.0) && (!NAN(pos->Z))) {
      uVar2 = (thing->flags).Value;
      if (ppVar12 == (player_t *)0x0) {
        if ((uVar2 >> 0x10 & 1) == 0) goto LAB_00458192;
      }
      else if (((uVar2 >> 9 & 1) == 0) || ((dVar6 == 0.0 && (!NAN(dVar6))))) {
LAB_00458192:
        pos->Z = dVar19;
        goto LAB_00458198;
      }
      pos->Z = dVar6 + dVar19;
      if (dVar18 < dVar6 + dVar19 + thing->Height) {
        pos->Z = dVar18 - thing->Height;
      }
    }
  }
  else {
    pos->Z = dVar6 + dVar19;
  }
LAB_00458198:
  bVar8 = P_TeleportMove(thing,pos,false,true);
  if (!bVar8) {
    return bVar8;
  }
  if (ppVar12 != (player_t *)0x0) {
    ppVar12->viewz = (thing->__Pos).Z + ppVar12->viewheight;
  }
  pAVar1 = &(thing->Angles).Yaw;
  pAVar11 = pAVar1;
  if ((flags & 4U) != 0) {
    pAVar11 = angle;
    angle = pAVar1;
  }
  pAVar11->Degrees = angle->Degrees;
  if ((flags & 2U) != 0 && bVar13 == 0) {
    P_SpawnTeleportFog(thing,&local_88,true,true);
  }
  if ((flags & 1U) == 0) {
    if (thing->player == (player_t *)0x0) goto LAB_00458334;
  }
  else {
    if (bVar13 == 0) {
      TAngle<double>::ToVector(&local_58,20.0);
      P_GetOffsetPosition(pos->X,pos->Y,local_58.Degrees,local_50);
      local_48.Z = (thing->__Pos).Z;
      local_48.X = local_68;
      local_48.Y = dStack_60;
      P_SpawnTeleportFog(thing,&local_48,false,true);
    }
    ppVar4 = thing->player;
    if (ppVar4 == (player_t *)0x0) goto LAB_00458334;
    if (((telezoom.Value == true) && ((flags & 8U) == 0)) && (ppVar4->mo == (APlayerPawn *)thing)) {
      fVar15 = ppVar4->DesiredFOV + 45.0;
      fVar17 = 175.0;
      if (fVar15 <= 175.0) {
        fVar17 = fVar15;
      }
      ppVar4->FOV = fVar17;
    }
  }
  if ((char)((flags & 8U) >> 3) == '\0' && (flags & 5U) != 4) {
    this = (thing->Inventory).field_0.p;
    if (this != (AInventory *)0x0) {
      if (((this->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        bVar9 = AInventory::GetNoTeleportFreeze(this);
        if (bVar9) goto LAB_00458334;
      }
      else {
        (thing->Inventory).field_0.p = (AInventory *)0x0;
      }
    }
    thing->reactiontime = 0x12;
  }
LAB_00458334:
  if (((thing->flags).Value & 0x10000) == 0) {
    if ((flags & 0xcU) == 0) {
      (thing->Vel).X = 0.0;
      (thing->Vel).Y = 0.0;
      (thing->Vel).Z = 0.0;
      if (ppVar12 != (player_t *)0x0) {
        (ppVar12->Vel).X = 0.0;
        (ppVar12->Vel).Y = 0.0;
      }
    }
  }
  else {
    AActor::VelFromAngle(thing,(double)CONCAT44(uVar16,uVar14));
  }
  return bVar8;
}

Assistant:

bool P_Teleport (AActor *thing, DVector3 pos, DAngle angle, int flags)
{
	bool predicting = (thing->player && (thing->player->cheats & CF_PREDICTING));

	DVector3 old;
	double aboveFloor;
	player_t *player;
	sector_t *destsect;
	bool resetpitch = false;
	double floorheight, ceilingheight;
	double missilespeed = 0;

	old = thing->Pos();
	aboveFloor = thing->Z() - thing->floorz;
	destsect = P_PointInSector (pos);
	// killough 5/12/98: exclude voodoo dolls:
	player = thing->player;
	if (player && player->mo != thing)
		player = NULL;
	floorheight = destsect->floorplane.ZatPoint (pos);
	ceilingheight = destsect->ceilingplane.ZatPoint (pos);
	if (thing->flags & MF_MISSILE)
	{ // We don't measure z velocity, because it doesn't change.
		missilespeed = thing->VelXYToSpeed();
	}
	if (flags & TELF_KEEPHEIGHT)
	{
		pos.Z = floorheight + aboveFloor;
	}
	else if (pos.Z == ONFLOORZ)
	{
		if (player)
		{
			if (thing->flags & MF_NOGRAVITY && aboveFloor)
			{
				pos.Z = floorheight + aboveFloor;
				if (pos.Z + thing->Height > ceilingheight)
				{
					pos.Z = ceilingheight - thing->Height;
				}
			}
			else
			{
				pos.Z = floorheight;
				if (!(flags & TELF_KEEPORIENTATION))
				{
					resetpitch = false;
				}
			}
		}
		else if (thing->flags & MF_MISSILE)
		{
			pos.Z = floorheight + aboveFloor;
			if (pos.Z + thing->Height > ceilingheight)
			{
				pos.Z = ceilingheight - thing->Height;
			}
		}
		else
		{
			pos.Z = floorheight;
		}
	}
	if (!P_TeleportMove (thing, pos, false))
	{
		return false;
	}
	if (player)
	{
		player->viewz = thing->Z() + player->viewheight;
		if (resetpitch)
		{
			player->mo->Angles.Pitch = 0.;
		}
	}
	if (!(flags & TELF_KEEPORIENTATION))
	{
		thing->Angles.Yaw = angle;
	}
	else
	{
		angle = thing->Angles.Yaw;
	}
	// Spawn teleport fog at source and destination
	if ((flags & TELF_SOURCEFOG) && !predicting)
	{
		P_SpawnTeleportFog(thing, old, true, true); //Passes the actor through which then pulls the TeleFog metadata types based on properties.
	}
	if (flags & TELF_DESTFOG)
	{
		if (!predicting)
		{
			DVector2 vector = angle.ToVector(20);
			DVector2 fogpos = P_GetOffsetPosition(pos.X, pos.Y, vector.X, vector.Y);
			P_SpawnTeleportFog(thing, DVector3(fogpos, thing->Z()), false, true);

		}
		if (thing->player)
		{
			// [RH] Zoom player's field of vision
			// [BC] && bHaltVelocity.
			if (telezoom && thing->player->mo == thing && !(flags & TELF_KEEPVELOCITY))
				thing->player->FOV = MIN (175.f, thing->player->DesiredFOV + 45.f);
		}
	}
	// [BC] && bHaltVelocity.
	if (thing->player && ((flags & TELF_DESTFOG) || !(flags & TELF_KEEPORIENTATION)) && !(flags & TELF_KEEPVELOCITY))
	{
		// Freeze player for about .5 sec
		if (thing->Inventory == NULL || !thing->Inventory->GetNoTeleportFreeze())
			thing->reactiontime = 18;
	}
	if (thing->flags & MF_MISSILE)
	{
		thing->VelFromAngle(missilespeed);
	}
	// [BC] && bHaltVelocity.
	else if (!(flags & TELF_KEEPORIENTATION) && !(flags & TELF_KEEPVELOCITY))
	{ // no fog doesn't alter the player's momentum
		thing->Vel.Zero();
		// killough 10/98: kill all bobbing velocity too
		if (player)	player->Vel.Zero();
	}
	return true;
}